

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

IVec2 __thiscall
deqp::gles31::Functional::anon_unknown_0::RandomizedRenderGrid::getRandomOffset
          (RandomizedRenderGrid *this,deUint32 seed,IVec2 *targetSize,IVec2 *cellSize,IVec2 *grid,
          int cellCount)

{
  int iVar1;
  deUint32 a;
  deInt32 dVar2;
  int iVar3;
  int *piVar4;
  Vector<int,_2> local_64;
  Vector<int,_2> local_5c;
  IVec2 extraSpace;
  undefined1 local_44 [8];
  Random rng;
  int cellCount_local;
  IVec2 *grid_local;
  IVec2 *cellSize_local;
  IVec2 *targetSize_local;
  deUint32 seed_local;
  IVec2 *result;
  
  rng.m_rnd.z = cellCount;
  unique0x10000194 = grid;
  de::Random::Random((Random *)local_44,seed);
  tcu::Vector<int,_2>::Vector(&this->m_targetSize);
  tcu::operator*((tcu *)&local_64,cellSize,grid);
  tcu::operator-((tcu *)&local_5c,targetSize,&local_64);
  piVar4 = tcu::Vector<int,_2>::y(grid);
  a = rng.m_rnd.z;
  iVar3 = *piVar4;
  piVar4 = tcu::Vector<int,_2>::x(grid);
  dVar2 = deDivRoundUp32(a,*piVar4);
  piVar4 = tcu::Vector<int,_2>::y(cellSize);
  iVar1 = *piVar4;
  piVar4 = tcu::Vector<int,_2>::y(&local_5c);
  *piVar4 = *piVar4 + (iVar3 - dVar2) * iVar1;
  piVar4 = tcu::Vector<int,_2>::x(&local_5c);
  iVar3 = de::Random::getInt((Random *)local_44,0,*piVar4);
  piVar4 = tcu::Vector<int,_2>::x(&this->m_targetSize);
  *piVar4 = iVar3;
  piVar4 = tcu::Vector<int,_2>::y(&local_5c);
  iVar3 = de::Random::getInt((Random *)local_44,0,*piVar4);
  piVar4 = tcu::Vector<int,_2>::y(&this->m_targetSize);
  *piVar4 = iVar3;
  de::Random::~Random((Random *)local_44);
  return (IVec2)(int  [2])this;
}

Assistant:

IVec2 RandomizedRenderGrid::getRandomOffset (deUint32 seed, IVec2 targetSize, IVec2 cellSize, IVec2 grid, int cellCount)
{
	de::Random	rng			(seed);
	IVec2		result;
	IVec2		extraSpace = targetSize - (cellSize * grid);

	// If there'll be unused rows, donate them into extra space.
	// (Round the required rows to full cell row to find out how many rows are unused, multiply by size)
	DE_ASSERT(deDivRoundUp32(cellCount, grid.x()) <= grid.y());
	extraSpace.y() += (grid.y() - deDivRoundUp32(cellCount, grid.x())) * cellSize.y();

	DE_ASSERT(targetSize.x() > cellSize.x() && targetSize.y() > cellSize.y());
	// If grid fits perfectly just one row of cells, just give up on randomizing.
	DE_ASSERT(extraSpace.x() > 0 || extraSpace.y() > 0 || grid.y() == 1);
	DE_ASSERT(extraSpace.x() + grid.x() * cellSize.x() == targetSize.x());

	// \note Putting these as ctor params would make evaluation order undefined, I think <sigh>. Hence,
	// no direct return.
	result.x() = rng.getInt(0, extraSpace.x());
	result.y() = rng.getInt(0, extraSpace.y());
	return result;
}